

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::CompletionFlag::Reset(CompletionFlag *this)

{
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base.matched = false;
  this->cword = 0;
  (this->syntax)._M_string_length = 0;
  *(this->syntax)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->reply);
  return;
}

Assistant:

virtual void Reset() noexcept override
            {
                ValueFlagBase::Reset();
                cword = 0;
                syntax.clear();
                reply.clear();
            }